

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::visitLoop
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermLoop *node)

{
  Builder *this_00;
  uint uVar1;
  Block *block;
  TIntermNode *pTVar2;
  TIntermTyped *pTVar3;
  int iVar4;
  int iVar5;
  Id IVar6;
  LoopBlocks *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Block *pBVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar9;
  Block *pBVar10;
  uint control;
  uint local_6c;
  Block *local_68;
  Block *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  
  this_00 = &this->builder;
  pLVar7 = spv::Builder::makeNewLoop(this_00);
  block = pLVar7->head;
  pBVar10 = pLVar7->body;
  pBVar8 = pLVar7->merge;
  local_60 = pLVar7->continue_target;
  spv::Builder::createBranch(this_00,true,block);
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  control = (uint)node->unroll + (uint)node->dontUnroll * 2;
  uVar1 = node->dependency;
  if (uVar1 == 0xffffffff) {
    control = control | 4;
  }
  else if (0 < (int)uVar1) {
    control = control | 8;
    local_6c = uVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&operands,&local_6c);
  }
  local_68 = pBVar8;
  if (0x103ff < (this->glslangIntermediate->spvVersion).spv) {
    if (node->minIterations != 0) {
      control = control | 0x10;
      local_6c = node->minIterations;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&operands,&local_6c);
    }
    if (node->maxIterations != 0xffffffff) {
      control = control | 0x20;
      local_6c = node->maxIterations;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&operands,&local_6c);
    }
    if (1 < node->iterationMultiple) {
      control = control | 0x40;
      local_6c = node->iterationMultiple;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&operands,&local_6c);
    }
    if (node->peelCount != 0) {
      control = control | 0x80;
      local_6c = node->peelCount;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&operands,&local_6c);
    }
    if (node->partialCount != 0) {
      control = control | 0x100;
      local_6c = node->partialCount;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&operands,&local_6c);
    }
  }
  (this->builder).buildPoint = block;
  (this->builder).dirtyLineTracker = true;
  (this->builder).dirtyScopeTracker = true;
  iVar4 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  iVar4 = *(int *)(CONCAT44(extraout_var,iVar4) + 0xc);
  iVar5 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  if (*(long *)CONCAT44(extraout_var_00,iVar5) == 0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 8);
  }
  spv::Builder::setDebugSourceLocation(this_00,iVar4,pcVar9);
  spv::Builder::createLoopMerge(this_00,local_68,local_60,control,&operands);
  if ((node->first == true) && (node->test != (TIntermTyped *)0x0)) {
    pBVar8 = spv::Builder::makeNewBlock(this_00);
    spv::Builder::createBranch(this_00,true,pBVar8);
    (this->builder).buildPoint = pBVar8;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    (*(node->test->super_TIntermNode)._vptr_TIntermNode[2])(node->test,this);
    iVar4 = (*(node->test->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    IVar6 = accessChainLoad(this,(TType *)CONCAT44(extraout_var_01,iVar4));
    spv::Builder::createConditionalBranch(this_00,IVar6,pBVar10,local_68);
    (this->builder).buildPoint = pBVar10;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    local_6c = CONCAT31(local_6c._1_3_,1);
    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
              (&(this->breakForLoop).c,(bool *)&local_6c);
    pTVar2 = node->body;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,this);
    }
    pBVar10 = local_60;
    spv::Builder::createBranch(this_00,true,local_60);
    std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->breakForLoop).c);
    (this->builder).buildPoint = pBVar10;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    pTVar3 = node->terminal;
    if (pTVar3 != (TIntermTyped *)0x0) {
      (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[2])(pTVar3,this);
    }
    spv::Builder::createBranch(this_00,true,block);
    pBVar10 = local_68;
  }
  else {
    iVar4 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    iVar4 = *(int *)(CONCAT44(extraout_var_02,iVar4) + 0xc);
    iVar5 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    if (*(long *)CONCAT44(extraout_var_03,iVar5) == 0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = *(char **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 8);
    }
    spv::Builder::setDebugSourceLocation(this_00,iVar4,pcVar9);
    spv::Builder::createBranch(this_00,true,pBVar10);
    local_6c = CONCAT31(local_6c._1_3_,1);
    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
              (&(this->breakForLoop).c,(bool *)&local_6c);
    (this->builder).buildPoint = pBVar10;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    pTVar2 = node->body;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,this);
    }
    pBVar10 = local_60;
    spv::Builder::createBranch(this_00,true,local_60);
    std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->breakForLoop).c);
    (this->builder).buildPoint = pBVar10;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    pTVar3 = node->terminal;
    if (pTVar3 != (TIntermTyped *)0x0) {
      (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[2])(pTVar3,this);
    }
    pBVar10 = local_68;
    pTVar3 = node->test;
    if (pTVar3 == (TIntermTyped *)0x0) {
      spv::Builder::createBranch(this_00,true,block);
    }
    else {
      (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[2])(pTVar3,this);
      iVar4 = (*(node->test->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      IVar6 = accessChainLoad(this,(TType *)CONCAT44(extraout_var_04,iVar4));
      spv::Builder::createConditionalBranch(this_00,IVar6,block,pBVar10);
    }
  }
  (this->builder).buildPoint = pBVar10;
  (this->builder).dirtyLineTracker = true;
  (this->builder).dirtyScopeTracker = true;
  spv::Builder::closeLoop(this_00);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitLoop(glslang::TVisit /* visit */, glslang::TIntermLoop* node)
{
    auto blocks = builder.makeNewLoop();
    builder.createBranch(true, &blocks.head);

    // Loop control:
    std::vector<unsigned int> operands;
    const spv::LoopControlMask control = TranslateLoopControl(*node, operands);

    // Spec requires back edges to target header blocks, and every header block
    // must dominate its merge block.  Make a header block first to ensure these
    // conditions are met.  By definition, it will contain OpLoopMerge, followed
    // by a block-ending branch.  But we don't want to put any other body/test
    // instructions in it, since the body/test may have arbitrary instructions,
    // including merges of its own.
    builder.setBuildPoint(&blocks.head);
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());
    builder.createLoopMerge(&blocks.merge, &blocks.continue_target, control, operands);
    if (node->testFirst() && node->getTest()) {
        spv::Block& test = builder.makeNewBlock();
        builder.createBranch(true, &test);

        builder.setBuildPoint(&test);
        node->getTest()->traverse(this);
        spv::Id condition = accessChainLoad(node->getTest()->getType());
        builder.createConditionalBranch(condition, &blocks.body, &blocks.merge);

        builder.setBuildPoint(&blocks.body);
        breakForLoop.push(true);
        if (node->getBody())
            node->getBody()->traverse(this);
        builder.createBranch(true, &blocks.continue_target);
        breakForLoop.pop();

        builder.setBuildPoint(&blocks.continue_target);
        if (node->getTerminal())
            node->getTerminal()->traverse(this);
        builder.createBranch(true, &blocks.head);
    } else {
        builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());
        builder.createBranch(true, &blocks.body);

        breakForLoop.push(true);
        builder.setBuildPoint(&blocks.body);
        if (node->getBody())
            node->getBody()->traverse(this);
        builder.createBranch(true, &blocks.continue_target);
        breakForLoop.pop();

        builder.setBuildPoint(&blocks.continue_target);
        if (node->getTerminal())
            node->getTerminal()->traverse(this);
        if (node->getTest()) {
            node->getTest()->traverse(this);
            spv::Id condition =
                accessChainLoad(node->getTest()->getType());
            builder.createConditionalBranch(condition, &blocks.head, &blocks.merge);
        } else {
            // TODO: unless there was a break/return/discard instruction
            // somewhere in the body, this is an infinite loop, so we should
            // issue a warning.
            builder.createBranch(true, &blocks.head);
        }
    }
    builder.setBuildPoint(&blocks.merge);
    builder.closeLoop();
    return false;
}